

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blurImage.cpp
# Opt level: O1

void blurImage(EnvmapImage *image1,bool verbose)

{
  Rgba *pRVar1;
  char cVar2;
  ushort uVar3;
  Envmap EVar4;
  undefined4 uVar5;
  int iVar6;
  Box2i *pBVar7;
  ostream *poVar8;
  Array2D<Imf_3_2::Rgba> *pAVar9;
  long *plVar10;
  long lVar11;
  Rgba *pRVar12;
  long lVar13;
  long lVar14;
  int f;
  int iVar15;
  uint uVar16;
  int x;
  uint uVar17;
  undefined7 in_register_00000031;
  uint16_t uVar18;
  uint uVar19;
  int y1;
  int iVar20;
  EnvmapImage *pEVar21;
  int x1;
  int iVar22;
  EnvmapImage *pEVar23;
  int f1;
  int iVar24;
  Box *pBVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  float fVar29;
  double dVar30;
  double dVar31;
  undefined1 auVar32 [16];
  float fVar33;
  float fVar34;
  float fVar35;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  V2f posInFace2;
  V2f posInFace1;
  V2f pos2;
  Box2i dw;
  V2f pos;
  V2f posInFace;
  V3f dir1;
  V2f pos1;
  EnvmapImage image2;
  float local_170;
  float local_160;
  undefined4 uStack_15c;
  float *local_158;
  float local_150;
  undefined4 uStack_14c;
  EnvmapImage *local_148;
  float local_140;
  float local_13c;
  Array2D<Imf_3_2::Rgba> *local_138;
  float *local_130;
  uint local_124;
  Rgba *local_120;
  Box2i local_118;
  double local_100;
  Box2i local_f8;
  double local_e0;
  float local_d8;
  float fStack_d4;
  float local_d0;
  undefined1 local_c8 [16];
  EnvmapImage *local_b8;
  EnvmapImage *local_b0;
  float local_a4;
  float local_a0;
  float local_9c;
  undefined1 local_98 [24];
  float local_80;
  float local_7c;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 local_68;
  EnvmapImage local_60;
  undefined8 uVar36;
  
  if ((int)CONCAT71(in_register_00000031,verbose) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"blurring map image",0x12);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
    std::ostream::put(-0x48);
    std::ostream::flush();
  }
  local_148 = &local_60;
  EnvmapImage::EnvmapImage(local_148);
  pBVar7 = EnvmapImage::dataWindow(image1);
  iVar15 = (pBVar7->max).x;
  pBVar7 = EnvmapImage::dataWindow(image1);
  iVar15 = iVar15 - (pBVar7->min).x;
  local_b8 = image1;
  EVar4 = EnvmapImage::type(image1);
  uVar16 = iVar15 + 1;
  pEVar21 = local_b8;
  if (EVar4 == ENVMAP_LATLONG) {
    if (verbose) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"    converting to cube-face format",0x22);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
      std::ostream::put(-0x48);
      std::ostream::flush();
    }
    pEVar21 = local_b8;
    uVar17 = iVar15 + 4;
    if (-1 < (int)uVar16) {
      uVar17 = uVar16;
    }
    uVar16 = (int)uVar17 >> 2;
    local_118.min.x = 0;
    local_118.min.y = 0;
    local_118.max.y = uVar16 * 6 + -1;
    local_118.max.x = uVar16 - 1;
    resizeCube(local_b8,&local_60,&local_118,1.0,7);
    local_148 = pEVar21;
    pEVar21 = &local_60;
  }
  if (0x28 < (int)uVar16) {
    pEVar23 = pEVar21;
    do {
      pEVar21 = local_148;
      bVar26 = (int)uVar16 < 0x50;
      uVar16 = uVar16 >> 1;
      if (bVar26) {
        uVar16 = 0x28;
      }
      local_148 = pEVar23;
      if (verbose) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"    resizing cube faces to ",0x1b);
        poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,uVar16);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8," by ",4);
        poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,uVar16);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8," pixels",7);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
        std::ostream::put((char)poVar8);
        std::ostream::flush();
      }
      local_118.min.x = 0;
      local_118.min.y = 0;
      local_118.max.y = uVar16 * 6 + -1;
      local_118.max.x = uVar16 - 1;
      resizeCube(local_148,pEVar21,&local_118,1.0,7);
      pEVar23 = pEVar21;
    } while (0x28 < uVar16);
  }
  local_b0 = pEVar21;
  if (verbose) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"    computing pixel weights",0x1b);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
    std::ostream::put(-0x48);
    std::ostream::flush();
  }
  pEVar21 = local_b0;
  pBVar7 = EnvmapImage::dataWindow(local_b0);
  local_118.min = pBVar7->min;
  local_118.max = pBVar7->max;
  local_c8._0_8_ = Imf_3_2::CubeMap::sizeOfFace((Box *)&local_118);
  pAVar9 = EnvmapImage::pixels(pEVar21);
  local_100 = (double)CONCAT44(local_100._4_4_,local_c8._0_4_ + -1);
  uVar16 = 0;
  local_e0 = 0.0;
  do {
    if (verbose) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"        face ",0xd);
      plVar10 = (long *)std::ostream::operator<<((ostream *)&std::cout,uVar16);
      std::ios::widen((char)*(undefined8 *)(*plVar10 + -0x18) + (char)plVar10);
      std::ostream::put((char)plVar10);
      std::ostream::flush();
    }
    pRVar1 = local_120;
    local_120 = (Rgba *)((ulong)local_120 & 0xffffffff00000000);
    switch(uVar16) {
    case 0:
      fVar29 = 1.0;
      break;
    case 1:
      fVar29 = -1.0;
      break;
    case 2:
      local_170 = 1.0;
      goto LAB_00104438;
    case 3:
      local_170 = -1.0;
LAB_00104438:
      fVar29 = 0.0;
      local_158 = &local_150;
      local_130 = &local_160;
      local_138 = (Array2D<Imf_3_2::Rgba> *)&local_140;
      goto LAB_001044de;
    case 4:
      uVar5 = 0x3f800000;
      goto LAB_001044a2;
    case 5:
      uVar5 = 0xbf800000;
LAB_001044a2:
      fVar29 = 0.0;
      local_170 = 0.0;
      local_120 = (Rgba *)CONCAT44(SUB84(pRVar1,4),uVar5);
      local_158 = &local_140;
      local_130 = &local_160;
      local_138 = (Array2D<Imf_3_2::Rgba> *)&local_150;
      goto LAB_001044de;
    default:
      fVar29 = 0.0;
      local_170 = 0.0;
      local_138 = (Array2D<Imf_3_2::Rgba> *)&local_160;
      local_158 = (float *)local_138;
      local_130 = (float *)local_138;
      goto LAB_001044de;
    }
    local_170 = 0.0;
    local_158 = &local_150;
    local_130 = &local_140;
    local_138 = (Array2D<Imf_3_2::Rgba> *)&local_160;
LAB_001044de:
    if (0 < (int)local_c8._0_4_) {
      uVar17 = 0;
      do {
        local_124 = uVar17;
        bVar26 = local_124 != 0;
        bVar27 = local_124 != local_100._0_4_;
        local_98._0_4_ = (float)(int)local_124;
        uVar17 = 0;
        do {
          local_d8 = (float)(int)uVar17;
          bVar28 = local_100._0_4_ != uVar17;
          fStack_d4 = (float)local_98._0_4_;
          Imf_3_2::CubeMap::direction
                    ((CubeMapFace)&local_f8,(Box *)(ulong)uVar16,(Vec2 *)&local_118);
          fVar34 = (float)local_f8.max.x * (float)local_f8.max.x +
                   (float)local_f8.min.x * (float)local_f8.min.x +
                   (float)local_f8.min.y * (float)local_f8.min.y;
          if (fVar34 < 2.3509887e-38) {
            blurImage();
            fVar34 = local_a4;
          }
          else if (fVar34 < 0.0) {
            fVar34 = sqrtf(fVar34);
          }
          else {
            fVar34 = SQRT(fVar34);
          }
          local_160 = 0.0;
          if ((fVar34 != 0.0) || (NAN(fVar34))) {
            local_160 = (float)local_f8.min.x / fVar34;
            auVar37._4_4_ = local_f8.max.x;
            auVar37._0_4_ = local_f8.min.y;
            auVar37._8_8_ = 0;
            auVar38._4_4_ = fVar34;
            auVar38._0_4_ = fVar34;
            auVar38._8_4_ = fVar34;
            auVar38._12_4_ = fVar34;
            auVar38 = divps(auVar37,auVar38);
            uVar36 = auVar38._0_8_;
          }
          else {
            uVar36 = 0;
          }
          local_140 = (float)uVar36;
          local_150 = (float)((ulong)uVar36 >> 0x20);
          local_68 = CONCAT44(fStack_d4,local_d8);
          Imf_3_2::CubeMap::pixelPosition(&local_f8,uVar16,&local_118,&local_68);
          lVar13 = _imath_half_to_float_table;
          dVar31 = (double)(*local_130 / *(float *)local_138);
          dVar30 = (double)(*local_158 / *(float *)local_138);
          dVar31 = (dVar30 * dVar30 + dVar31 * dVar31 + 1.0) *
                   (double)(local_150 * local_120._0_4_ + local_160 * fVar29 + local_140 * local_170
                           );
          if (uVar17 != 0 && bVar28 || bVar27 && bVar26) {
            if ((uVar17 == 0 || !bVar28) || (!bVar27 || !bVar26)) {
              dVar31 = dVar31 * 0.5;
            }
          }
          else {
            dVar31 = dVar31 / 3.0;
          }
          lVar11 = (long)(int)((float)local_f8.min.y + 0.5) * pAVar9->_sizeY;
          pRVar1 = pAVar9->_data;
          lVar14 = (long)(int)((float)local_f8.min.x + 0.5);
          fVar33 = (float)dVar31;
          fVar35 = *(float *)(_imath_half_to_float_table + (ulong)pRVar1[lVar11 + lVar14].r._h * 4)
                   * fVar33;
          fVar34 = ABS(fVar35);
          uVar18 = (ushort)((uint)fVar35 >> 0x10) & 0x8000;
          if ((uint)fVar34 < 0x38800000) {
            if ((0x33000000 < (uint)fVar34) &&
               (uVar19 = (uint)fVar34 & 0x7fffff | 0x800000, cVar2 = (char)((uint)fVar34 >> 0x17),
               uVar18 = uVar18 | (ushort)(uVar19 >> (0x7eU - cVar2 & 0x1f)),
               0x80000000 < uVar19 << (cVar2 + 0xa2U & 0x1f))) {
              uVar18 = uVar18 + 1;
            }
          }
          else if ((uint)fVar34 < 0x7f800000) {
            if ((uint)fVar34 < 0x477ff000) {
              uVar18 = (ushort)((int)fVar34 + 0x8000fff + (uint)(((uint)fVar34 >> 0xd & 1) != 0) >>
                               0xd) | uVar18;
            }
            else {
              uVar18 = uVar18 | 0x7c00;
            }
          }
          else {
            uVar18 = uVar18 | 0x7c00;
            if (fVar34 != INFINITY) {
              uVar19 = (uint)fVar34 >> 0xd & 0x3ff;
              uVar18 = uVar18 | (ushort)uVar19 | (ushort)(uVar19 == 0);
            }
          }
          pRVar1[lVar11 + lVar14].r._h = uVar18;
          fVar35 = *(float *)(lVar13 + (ulong)pRVar1[lVar11 + lVar14].g._h * 4) * fVar33;
          fVar34 = ABS(fVar35);
          uVar18 = (ushort)((uint)fVar35 >> 0x10) & 0x8000;
          if ((uint)fVar34 < 0x38800000) {
            if ((0x33000000 < (uint)fVar34) &&
               (uVar19 = (uint)fVar34 & 0x7fffff | 0x800000, cVar2 = (char)((uint)fVar34 >> 0x17),
               uVar18 = uVar18 | (ushort)(uVar19 >> (0x7eU - cVar2 & 0x1f)),
               0x80000000 < uVar19 << (cVar2 + 0xa2U & 0x1f))) {
              uVar18 = uVar18 + 1;
            }
          }
          else if ((uint)fVar34 < 0x7f800000) {
            if ((uint)fVar34 < 0x477ff000) {
              uVar18 = (ushort)((int)fVar34 + 0x8000fff + (uint)(((uint)fVar34 >> 0xd & 1) != 0) >>
                               0xd) | uVar18;
            }
            else {
              uVar18 = uVar18 | 0x7c00;
            }
          }
          else {
            uVar18 = uVar18 | 0x7c00;
            if (fVar34 != INFINITY) {
              uVar19 = (uint)fVar34 >> 0xd & 0x3ff;
              uVar18 = uVar18 | (ushort)uVar19 | (ushort)(uVar19 == 0);
            }
          }
          pRVar1[lVar11 + lVar14].g._h = uVar18;
          fVar35 = *(float *)(lVar13 + (ulong)pRVar1[lVar11 + lVar14].b._h * 4) * fVar33;
          fVar34 = ABS(fVar35);
          uVar18 = (ushort)((uint)fVar35 >> 0x10) & 0x8000;
          if ((uint)fVar34 < 0x38800000) {
            if ((0x33000000 < (uint)fVar34) &&
               (uVar19 = (uint)fVar34 & 0x7fffff | 0x800000, cVar2 = (char)((uint)fVar34 >> 0x17),
               uVar18 = uVar18 | (ushort)(uVar19 >> (0x7eU - cVar2 & 0x1f)),
               0x80000000 < uVar19 << (cVar2 + 0xa2U & 0x1f))) {
              uVar18 = uVar18 + 1;
            }
          }
          else if ((uint)fVar34 < 0x7f800000) {
            if ((uint)fVar34 < 0x477ff000) {
              uVar18 = (ushort)((int)fVar34 + 0x8000fff + (uint)(((uint)fVar34 >> 0xd & 1) != 0) >>
                               0xd) | uVar18;
            }
            else {
              uVar18 = uVar18 | 0x7c00;
            }
          }
          else {
            uVar18 = uVar18 | 0x7c00;
            if (fVar34 != INFINITY) {
              uVar19 = (uint)fVar34 >> 0xd & 0x3ff;
              uVar18 = uVar18 | (ushort)uVar19 | (ushort)(uVar19 == 0);
            }
          }
          pRVar1[lVar11 + lVar14].b._h = uVar18;
          fVar33 = fVar33 * *(float *)(lVar13 + (ulong)pRVar1[lVar11 + lVar14].a._h * 4);
          fVar34 = ABS(fVar33);
          uVar18 = (ushort)((uint)fVar33 >> 0x10) & 0x8000;
          if ((uint)fVar34 < 0x38800000) {
            if ((0x33000000 < (uint)fVar34) &&
               (uVar19 = (uint)fVar34 & 0x7fffff | 0x800000, cVar2 = (char)((uint)fVar34 >> 0x17),
               uVar18 = uVar18 | (ushort)(uVar19 >> (0x7eU - cVar2 & 0x1f)),
               0x80000000 < uVar19 << (cVar2 + 0xa2U & 0x1f))) {
              uVar18 = uVar18 + 1;
            }
          }
          else if ((uint)fVar34 < 0x7f800000) {
            if ((uint)fVar34 < 0x477ff000) {
              uVar18 = (ushort)((int)fVar34 + 0x8000fff + (uint)(((uint)fVar34 >> 0xd & 1) != 0) >>
                               0xd) | uVar18;
            }
            else {
              uVar18 = uVar18 | 0x7c00;
            }
          }
          else {
            uVar18 = uVar18 | 0x7c00;
            if (fVar34 != INFINITY) {
              uVar19 = (uint)fVar34 >> 0xd & 0x3ff;
              uVar18 = uVar18 | (ushort)uVar19 | (ushort)(uVar19 == 0);
            }
          }
          pRVar1[lVar11 + lVar14].a._h = uVar18;
          local_e0 = local_e0 + dVar31;
          uVar17 = uVar17 + 1;
        } while (local_c8._0_4_ != uVar17);
        uVar17 = local_124 + 1;
      } while (local_124 + 1 != local_c8._0_4_);
    }
    lVar13 = _imath_half_to_float_table;
    uVar16 = uVar16 + 1;
    if (uVar16 == 6) {
      iVar15 = ((local_118.max.y - local_118.min.y) + 1) * ((local_118.max.x - local_118.min.x) + 1)
      ;
      if (0 < iVar15) {
        pRVar12 = pAVar9->_data;
        auVar32._8_4_ = iVar15 >> 0x1f;
        auVar32._0_8_ = (long)iVar15;
        auVar32._12_4_ = 0x45300000;
        pRVar1 = pRVar12 + iVar15;
        fVar29 = (float)(((auVar32._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,iVar15) - 4503599627370496.0)) / local_e0);
        do {
          fVar33 = *(float *)(lVar13 + (ulong)(pRVar12->r)._h * 4) * fVar29;
          fVar34 = ABS(fVar33);
          uVar18 = (ushort)((uint)fVar33 >> 0x10) & 0x8000;
          if ((uint)fVar34 < 0x38800000) {
            if ((0x33000000 < (uint)fVar34) &&
               (uVar16 = (uint)fVar34 & 0x7fffff | 0x800000, cVar2 = (char)((uint)fVar34 >> 0x17),
               uVar18 = uVar18 | (ushort)(uVar16 >> (0x7eU - cVar2 & 0x1f)),
               0x80000000 < uVar16 << (cVar2 + 0xa2U & 0x1f))) {
              uVar18 = uVar18 + 1;
            }
          }
          else if ((uint)fVar34 < 0x7f800000) {
            if ((uint)fVar34 < 0x477ff000) {
              uVar18 = (ushort)((int)fVar34 + 0x8000fff + (uint)(((uint)fVar34 >> 0xd & 1) != 0) >>
                               0xd) | uVar18;
            }
            else {
              uVar18 = uVar18 | 0x7c00;
            }
          }
          else {
            uVar18 = uVar18 | 0x7c00;
            if (fVar34 != INFINITY) {
              uVar16 = (uint)fVar34 >> 0xd & 0x3ff;
              uVar18 = uVar18 | (ushort)uVar16 | (ushort)(uVar16 == 0);
            }
          }
          (pRVar12->r)._h = uVar18;
          fVar33 = *(float *)(lVar13 + (ulong)(pRVar12->g)._h * 4) * fVar29;
          fVar34 = ABS(fVar33);
          uVar18 = (ushort)((uint)fVar33 >> 0x10) & 0x8000;
          if ((uint)fVar34 < 0x38800000) {
            if ((0x33000000 < (uint)fVar34) &&
               (uVar16 = (uint)fVar34 & 0x7fffff | 0x800000, cVar2 = (char)((uint)fVar34 >> 0x17),
               uVar18 = uVar18 | (ushort)(uVar16 >> (0x7eU - cVar2 & 0x1f)),
               0x80000000 < uVar16 << (cVar2 + 0xa2U & 0x1f))) {
              uVar18 = uVar18 + 1;
            }
          }
          else if ((uint)fVar34 < 0x7f800000) {
            if ((uint)fVar34 < 0x477ff000) {
              uVar18 = (ushort)((int)fVar34 + 0x8000fff + (uint)(((uint)fVar34 >> 0xd & 1) != 0) >>
                               0xd) | uVar18;
            }
            else {
              uVar18 = uVar18 | 0x7c00;
            }
          }
          else {
            uVar18 = uVar18 | 0x7c00;
            if (fVar34 != INFINITY) {
              uVar16 = (uint)fVar34 >> 0xd & 0x3ff;
              uVar18 = uVar18 | (ushort)uVar16 | (ushort)(uVar16 == 0);
            }
          }
          (pRVar12->g)._h = uVar18;
          fVar33 = *(float *)(lVar13 + (ulong)(pRVar12->b)._h * 4) * fVar29;
          fVar34 = ABS(fVar33);
          uVar18 = (ushort)((uint)fVar33 >> 0x10) & 0x8000;
          if ((uint)fVar34 < 0x38800000) {
            if ((0x33000000 < (uint)fVar34) &&
               (uVar16 = (uint)fVar34 & 0x7fffff | 0x800000, cVar2 = (char)((uint)fVar34 >> 0x17),
               uVar18 = uVar18 | (ushort)(uVar16 >> (0x7eU - cVar2 & 0x1f)),
               0x80000000 < uVar16 << (cVar2 + 0xa2U & 0x1f))) {
              uVar18 = uVar18 + 1;
            }
          }
          else if ((uint)fVar34 < 0x7f800000) {
            if ((uint)fVar34 < 0x477ff000) {
              uVar18 = (ushort)((int)fVar34 + 0x8000fff + (uint)(((uint)fVar34 >> 0xd & 1) != 0) >>
                               0xd) | uVar18;
            }
            else {
              uVar18 = uVar18 | 0x7c00;
            }
          }
          else {
            uVar18 = uVar18 | 0x7c00;
            if (fVar34 != INFINITY) {
              uVar16 = (uint)fVar34 >> 0xd & 0x3ff;
              uVar18 = uVar18 | (ushort)uVar16 | (ushort)(uVar16 == 0);
            }
          }
          (pRVar12->b)._h = uVar18;
          fVar33 = *(float *)(lVar13 + (ulong)(pRVar12->a)._h * 4) * fVar29;
          fVar34 = ABS(fVar33);
          uVar18 = (ushort)((uint)fVar33 >> 0x10) & 0x8000;
          if ((uint)fVar34 < 0x38800000) {
            if ((0x33000000 < (uint)fVar34) &&
               (uVar16 = (uint)fVar34 & 0x7fffff | 0x800000, cVar2 = (char)((uint)fVar34 >> 0x17),
               uVar18 = uVar18 | (ushort)(uVar16 >> (0x7eU - cVar2 & 0x1f)),
               0x80000000 < uVar16 << (cVar2 + 0xa2U & 0x1f))) {
              uVar18 = uVar18 + 1;
            }
          }
          else if ((uint)fVar34 < 0x7f800000) {
            if ((uint)fVar34 < 0x477ff000) {
              uVar18 = (ushort)((int)fVar34 + 0x8000fff + (uint)(((uint)fVar34 >> 0xd & 1) != 0) >>
                               0xd) | uVar18;
            }
            else {
              uVar18 = uVar18 | 0x7c00;
            }
          }
          else {
            uVar18 = uVar18 | 0x7c00;
            if (fVar34 != INFINITY) {
              uVar16 = (uint)fVar34 >> 0xd & 0x3ff;
              uVar18 = uVar18 | (ushort)uVar16 | (ushort)(uVar16 == 0);
            }
          }
          (pRVar12->a)._h = uVar18;
          pRVar12 = pRVar12 + 1;
        } while (pRVar12 < pRVar1);
      }
      if (verbose) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"    generating blurred image",0x1c);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
        std::ostream::put(-0x48);
        std::ostream::flush();
      }
      pEVar21 = local_b0;
      pBVar7 = EnvmapImage::dataWindow(local_b0);
      local_118.min = pBVar7->min;
      local_118.max = pBVar7->max;
      iVar15 = Imf_3_2::CubeMap::sizeOfFace((Box *)&local_118);
      local_f8.min.x = 0;
      local_f8.min.y = 0;
      local_f8.max.x = 99;
      local_f8.max.y = 599;
      uVar5 = Imf_3_2::CubeMap::sizeOfFace((Box *)&local_f8);
      local_158 = (float *)CONCAT44(local_158._4_4_,uVar5);
      EnvmapImage::resize(local_148,ENVMAP_CUBE,&local_f8);
      EnvmapImage::clear(local_148);
      pAVar9 = EnvmapImage::pixels(pEVar21);
      local_138 = EnvmapImage::pixels(local_148);
      uVar16 = 0;
      do {
        if (verbose) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"        face ",0xd);
          plVar10 = (long *)std::ostream::operator<<((ostream *)&std::cout,uVar16);
          std::ios::widen((char)*(undefined8 *)(*plVar10 + -0x18) + (char)plVar10);
          std::ostream::put((char)plVar10);
          std::ostream::flush();
        }
        if (0 < (int)local_158) {
          iVar24 = 0;
          local_124 = uVar16;
          do {
            local_b0 = (EnvmapImage *)CONCAT44(local_b0._4_4_,iVar24);
            local_130 = (float *)CONCAT44(local_130._4_4_,(float)iVar24);
            iVar24 = 0;
            do {
              uVar16 = local_124;
              local_160 = (float)iVar24;
              uStack_15c = local_130._0_4_;
              Imf_3_2::CubeMap::direction
                        ((CubeMapFace)&local_d8,(Box *)(ulong)local_124,(Vec2 *)&local_f8);
              local_70 = CONCAT44(uStack_15c,local_160);
              Imf_3_2::CubeMap::pixelPosition(&local_140,uVar16,&local_f8,&local_70);
              local_120 = local_138->_data + (long)(int)(local_13c + 0.5) * local_138->_sizeY;
              iVar6 = (int)(local_140 + 0.5);
              local_98._0_16_ = ZEXT416(0);
              local_100 = 0.0;
              pBVar25 = (Box *)0x0;
              local_c8 = ZEXT816(0);
              do {
                if (0 < iVar15) {
                  iVar20 = 0;
                  do {
                    local_e0 = (double)CONCAT44(local_e0._4_4_,(float)iVar20);
                    iVar22 = 0;
                    do {
                      local_150 = (float)iVar22;
                      uStack_14c = local_e0._0_4_;
                      Imf_3_2::CubeMap::direction((CubeMapFace)&local_a4,pBVar25,(Vec2 *)&local_118)
                      ;
                      local_78 = CONCAT44(uStack_14c,local_150);
                      Imf_3_2::CubeMap::pixelPosition(&local_80,pBVar25,&local_118,&local_78);
                      fVar29 = local_9c * local_d0 + local_a4 * local_d8 + local_a0 * fStack_d4;
                      if (0.0 < fVar29) {
                        lVar13 = (long)(int)(local_7c + 0.5) * pAVar9->_sizeY;
                        pRVar1 = pAVar9->_data;
                        dVar30 = (double)fVar29;
                        lVar11 = (long)(int)(local_80 + 0.5);
                        local_100 = local_100 + dVar30;
                        dVar31 = (double)local_98._8_8_ +
                                 (double)*(float *)(_imath_half_to_float_table +
                                                   (ulong)pRVar1[lVar13 + lVar11].g._h * 4) * dVar30
                        ;
                        local_98._8_4_ = SUB84(dVar31,0);
                        local_98._0_8_ =
                             (double)local_98._0_8_ +
                             (double)*(float *)(_imath_half_to_float_table +
                                               (ulong)pRVar1[lVar13 + lVar11].r._h * 4) * dVar30;
                        local_98._12_4_ = (int)((ulong)dVar31 >> 0x20);
                        local_c8._0_8_ =
                             (double)local_c8._0_8_ +
                             dVar30 * (double)*(float *)(_imath_half_to_float_table +
                                                        (ulong)pRVar1[lVar13 + lVar11].b._h * 4);
                        local_c8._8_8_ =
                             (double)local_c8._8_8_ +
                             dVar30 * (double)*(float *)(_imath_half_to_float_table +
                                                        (ulong)pRVar1[lVar13 + lVar11].a._h * 4);
                      }
                      iVar22 = iVar22 + 1;
                    } while (iVar15 != iVar22);
                    iVar20 = iVar20 + 1;
                  } while (iVar20 != iVar15);
                }
                uVar16 = (int)pBVar25 + 1;
                pBVar25 = (Box *)(ulong)uVar16;
              } while (uVar16 != 6);
              fVar29 = ABS((float)((double)local_98._0_8_ / local_100));
              uVar3 = (ushort)((uint)(float)((double)local_98._0_8_ / local_100) >> 0x10) & 0x8000;
              if ((uint)fVar29 < 0x38800000) {
                if ((0x33000000 < (uint)fVar29) &&
                   (uVar16 = (uint)fVar29 & 0x7fffff | 0x800000,
                   cVar2 = (char)((uint)fVar29 >> 0x17),
                   uVar3 = uVar3 | (ushort)(uVar16 >> (0x7eU - cVar2 & 0x1f)),
                   0x80000000 < uVar16 << (cVar2 + 0xa2U & 0x1f))) {
                  uVar3 = uVar3 + 1;
                }
              }
              else if ((uint)fVar29 < 0x7f800000) {
                if ((uint)fVar29 < 0x477ff000) {
                  uVar3 = (ushort)((int)fVar29 + 0x8000fff + (uint)(((uint)fVar29 >> 0xd & 1) != 0)
                                  >> 0xd) | uVar3;
                }
                else {
                  uVar3 = uVar3 | 0x7c00;
                }
              }
              else {
                uVar3 = uVar3 | 0x7c00;
                if (fVar29 != INFINITY) {
                  uVar16 = (uint)fVar29 >> 0xd & 0x3ff;
                  uVar3 = uVar3 | (ushort)uVar16 | (ushort)(uVar16 == 0);
                }
              }
              local_120[iVar6].r._h = uVar3;
              fVar29 = ABS((float)((double)local_98._8_8_ / local_100));
              uVar3 = (ushort)((uint)(float)((double)local_98._8_8_ / local_100) >> 0x10) & 0x8000;
              if ((uint)fVar29 < 0x38800000) {
                if ((0x33000000 < (uint)fVar29) &&
                   (uVar16 = (uint)fVar29 & 0x7fffff | 0x800000,
                   cVar2 = (char)((uint)fVar29 >> 0x17),
                   uVar3 = uVar3 | (ushort)(uVar16 >> (0x7eU - cVar2 & 0x1f)),
                   0x80000000 < uVar16 << (cVar2 + 0xa2U & 0x1f))) {
                  uVar3 = uVar3 + 1;
                }
              }
              else if ((uint)fVar29 < 0x7f800000) {
                if ((uint)fVar29 < 0x477ff000) {
                  uVar3 = (ushort)((int)fVar29 + 0x8000fff + (uint)(((uint)fVar29 >> 0xd & 1) != 0)
                                  >> 0xd) | uVar3;
                }
                else {
                  uVar3 = uVar3 | 0x7c00;
                }
              }
              else {
                uVar3 = uVar3 | 0x7c00;
                if (fVar29 != INFINITY) {
                  uVar16 = (uint)fVar29 >> 0xd & 0x3ff;
                  uVar3 = uVar3 | (ushort)uVar16 | (ushort)(uVar16 == 0);
                }
              }
              local_120[iVar6].g._h = uVar3;
              fVar29 = ABS((float)((double)local_c8._0_8_ / local_100));
              uVar3 = (ushort)((uint)(float)((double)local_c8._0_8_ / local_100) >> 0x10) & 0x8000;
              if ((uint)fVar29 < 0x38800000) {
                if ((0x33000000 < (uint)fVar29) &&
                   (uVar16 = (uint)fVar29 & 0x7fffff | 0x800000,
                   cVar2 = (char)((uint)fVar29 >> 0x17),
                   uVar3 = uVar3 | (ushort)(uVar16 >> (0x7eU - cVar2 & 0x1f)),
                   0x80000000 < uVar16 << (cVar2 + 0xa2U & 0x1f))) {
                  uVar3 = uVar3 + 1;
                }
              }
              else if ((uint)fVar29 < 0x7f800000) {
                if ((uint)fVar29 < 0x477ff000) {
                  uVar3 = (ushort)((int)fVar29 + 0x8000fff + (uint)(((uint)fVar29 >> 0xd & 1) != 0)
                                  >> 0xd) | uVar3;
                }
                else {
                  uVar3 = uVar3 | 0x7c00;
                }
              }
              else {
                uVar3 = uVar3 | 0x7c00;
                if (fVar29 != INFINITY) {
                  uVar16 = (uint)fVar29 >> 0xd & 0x3ff;
                  uVar3 = uVar3 | (ushort)uVar16 | (ushort)(uVar16 == 0);
                }
              }
              local_120[iVar6].b._h = uVar3;
              fVar29 = ABS((float)((double)local_c8._8_8_ / local_100));
              uVar3 = (ushort)((uint)(float)((double)local_c8._8_8_ / local_100) >> 0x10) & 0x8000;
              if ((uint)fVar29 < 0x38800000) {
                if ((0x33000000 < (uint)fVar29) &&
                   (uVar16 = (uint)fVar29 & 0x7fffff | 0x800000,
                   cVar2 = (char)((uint)fVar29 >> 0x17),
                   uVar3 = uVar3 | (ushort)(uVar16 >> (0x7eU - cVar2 & 0x1f)),
                   0x80000000 < uVar16 << (cVar2 + 0xa2U & 0x1f))) {
                  uVar3 = uVar3 + 1;
                }
              }
              else if ((uint)fVar29 < 0x7f800000) {
                if ((uint)fVar29 < 0x477ff000) {
                  uVar3 = (ushort)((int)fVar29 + 0x8000fff + (uint)(((uint)fVar29 >> 0xd & 1) != 0)
                                  >> 0xd) | uVar3;
                }
                else {
                  uVar3 = uVar3 | 0x7c00;
                }
              }
              else {
                uVar3 = uVar3 | 0x7c00;
                if (fVar29 != INFINITY) {
                  uVar16 = (uint)fVar29 >> 0xd & 0x3ff;
                  uVar3 = uVar3 | (ushort)uVar16 | (ushort)(uVar16 == 0);
                }
              }
              local_120[iVar6].a._h = uVar3;
              iVar24 = iVar24 + 1;
            } while (iVar24 != (int)local_158);
            iVar24 = (int)local_b0 + 1;
            uVar16 = local_124;
          } while (iVar24 != (int)local_158);
        }
        uVar16 = uVar16 + 1;
      } while (uVar16 != 6);
      if (local_148 != local_b8) {
        if (verbose) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"    copying",0xb);
          std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
        }
        pBVar7 = EnvmapImage::dataWindow(local_148);
        pEVar21 = local_b8;
        local_118.min = pBVar7->min;
        local_118.max = pBVar7->max;
        EnvmapImage::resize(local_b8,ENVMAP_CUBE,&local_118);
        iVar15 = local_118.max.x - local_118.min.x;
        iVar24 = local_118.max.y - local_118.min.y;
        pAVar9 = EnvmapImage::pixels(pEVar21);
        pRVar1 = pAVar9->_data;
        pAVar9 = EnvmapImage::pixels(local_148);
        memcpy(pRVar1,pAVar9->_data,(long)((iVar24 + 1) * (iVar15 + 1)) << 3);
      }
      if (local_60._pixels._data != (Rgba *)0x0) {
        operator_delete__(local_60._pixels._data);
      }
      return;
    }
  } while( true );
}

Assistant:

void
blurImage (EnvmapImage& image1, bool verbose)
{
    //
    // Ideally we would blur the input image directly by convolving
    // it with a 180-degree wide blur kernel.  Unfortunately this
    // is prohibitively expensive when the input image is large.
    // In order to keep running times reasonable, we perform the
    // blur on a small proxy image that will later be re-sampled
    // to the desired output resolution.
    //
    // Here's how it works:
    //
    // * If the input image is in latitude-longitude format,
    //   convert it into a cube-face environment map.
    //
    // * Repeatedly resample the image, each time shrinking
    //   it to no less than half its current size, until the
    //   width of each cube face is MAX_IN_WIDTH pixels.
    //
    // * Multiply each pixel by a weight that is proportional
    //   to the solid angle subtended by the pixel as seen
    //   from the center of the environment cube.
    //
    // * Create an output image in cube-face format.
    //   The cube faces of the output image are OUT_WIDTH
    //   pixels wide.
    //
    // * For each pixel of the output image:
    //
    //       Set the output pixel's color to black
    //
    //       Determine the direction, d2, from the center of the
    //       output environment cube to the center of the output
    //	     pixel.
    //
    //       For each pixel of the input image:
    //
    //           Determine the direction, d1, from the center of
    //           the input environment cube to the center of the
    //           input pixel.
    //
    //           Multiply the input pixel's color by max (0, d1.dot(d2))
    //           and add the result to the output pixel.
    //

    const int MAX_IN_WIDTH = 40;
    const int OUT_WIDTH    = 100;

    if (verbose) cout << "blurring map image" << endl;

    EnvmapImage  image2;
    EnvmapImage* iptr1 = &image1;
    EnvmapImage* iptr2 = &image2;

    int w = image1.dataWindow ().max.x - image1.dataWindow ().min.x + 1;
    int h = w * 6;

    if (iptr1->type () == ENVMAP_LATLONG)
    {
        //
        // Convert the input image from latitude-longitude
        // to cube-face format.
        //

        if (verbose) cout << "    converting to cube-face format" << endl;

        w /= 4;
        h = w * 6;

        Box2i dw (V2i (0, 0), V2i (w - 1, h - 1));
        resizeCube (*iptr1, *iptr2, dw, 1, 7);

        swap (iptr1, iptr2);
    }

    while (w > MAX_IN_WIDTH)
    {
        //
        // Shrink the image.
        //

        if (w >= MAX_IN_WIDTH * 2)
            w /= 2;
        else
            w = MAX_IN_WIDTH;

        h = w * 6;

        if (verbose)
        {
            cout << "    resizing cube faces "
                    "to "
                 << w << " by " << w << " pixels" << endl;
        }

        Box2i dw (V2i (0, 0), V2i (w - 1, h - 1));
        resizeCube (*iptr1, *iptr2, dw, 1, 7);

        swap (iptr1, iptr2);
    }

    if (verbose) cout << "    computing pixel weights" << endl;

    {
        //
        // Multiply each pixel by a weight that is proportional
        // to the solid angle subtended by the pixel.
        //

        Box2i dw  = iptr1->dataWindow ();
        int   sof = CubeMap::sizeOfFace (dw);

        Array2D<Rgba>& pixels = iptr1->pixels ();

        double weightTotal = 0;

        for (int f = CUBEFACE_POS_X; f <= CUBEFACE_NEG_Z; ++f)
        {
            if (verbose) cout << "        face " << f << endl;

            CubeMapFace face = CubeMapFace (f);
            V3f         faceDir (0, 0, 0);
            int         ix = 0, iy = 0, iz = 0;

            switch (face)
            {
                case CUBEFACE_POS_X:
                    faceDir = V3f (1, 0, 0);
                    ix      = 0;
                    iy      = 1;
                    iz      = 2;
                    break;

                case CUBEFACE_NEG_X:
                    faceDir = V3f (-1, 0, 0);
                    ix      = 0;
                    iy      = 1;
                    iz      = 2;
                    break;

                case CUBEFACE_POS_Y:
                    faceDir = V3f (0, 1, 0);
                    ix      = 1;
                    iy      = 0;
                    iz      = 2;
                    break;

                case CUBEFACE_NEG_Y:
                    faceDir = V3f (0, -1, 0);
                    ix      = 1;
                    iy      = 0;
                    iz      = 2;
                    break;

                case CUBEFACE_POS_Z:
                    faceDir = V3f (0, 0, 1);
                    ix      = 2;
                    iy      = 0;
                    iz      = 1;
                    break;

                case CUBEFACE_NEG_Z:
                    faceDir = V3f (0, 0, -1);
                    ix      = 2;
                    iy      = 0;
                    iz      = 1;
                    break;
            }

            for (int y = 0; y < sof; ++y)
            {
                bool yEdge = (y == 0 || y == sof - 1);

                for (int x = 0; x < sof; ++x)
                {
                    bool xEdge = (x == 0 || x == sof - 1);

                    V2f posInFace (x, y);

                    V3f dir =
                        CubeMap::direction (face, dw, posInFace).normalized ();

                    V2f pos = CubeMap::pixelPosition (face, dw, posInFace);

                    //
                    // The solid angle subtended by pixel (x,y), as seen
                    // from the center of the cube, is proportional to the
                    // square of the distance of the pixel from the center
                    // of the cube and proportional to the dot product of
                    // the viewing direction and the normal of the cube
                    // face that contains the pixel.
                    //

                    double weight =
                        (dir ^ faceDir) *
                        (sqr (dir[iy] / dir[ix]) + sqr (dir[iz] / dir[ix]) + 1);

                    //
                    // Pixels at the edges and corners of the
                    // cube are duplicated; we must adjust the
                    // pixel weights accordingly.
                    //

                    if (xEdge && yEdge)
                        weight /= 3;
                    else if (xEdge || yEdge)
                        weight /= 2;

                    Rgba& pixel = pixels[toInt (pos.y)][toInt (pos.x)];

                    pixel.r *= weight;
                    pixel.g *= weight;
                    pixel.b *= weight;
                    pixel.a *= weight;

                    weightTotal += weight;
                }
            }
        }

        //
        // The weighting operation above has made the overall image darker.
        // Apply a correction to recover the image's original brightness.
        //

        int    w         = dw.max.x - dw.min.x + 1;
        int    h         = dw.max.y - dw.min.y + 1;
        size_t numPixels = w * h;
        double weight    = numPixels / weightTotal;

        Rgba* p   = &pixels[0][0];
        Rgba* end = p + numPixels;

        while (p < end)
        {
            p->r *= weight;
            p->g *= weight;
            p->b *= weight;
            p->a *= weight;

            ++p;
        }
    }

    {
        if (verbose) cout << "    generating blurred image" << endl;

        Box2i dw1  = iptr1->dataWindow ();
        int   sof1 = CubeMap::sizeOfFace (dw1);

        Box2i dw2 (V2i (0, 0), V2i (OUT_WIDTH - 1, OUT_WIDTH * 6 - 1));
        int   sof2 = CubeMap::sizeOfFace (dw2);

        iptr2->resize (ENVMAP_CUBE, dw2);
        iptr2->clear ();

        Array2D<Rgba>& pixels1 = iptr1->pixels ();
        Array2D<Rgba>& pixels2 = iptr2->pixels ();

        for (int f2 = CUBEFACE_POS_X; f2 <= CUBEFACE_NEG_Z; ++f2)
        {
            if (verbose) cout << "        face " << f2 << endl;

            CubeMapFace face2 = CubeMapFace (f2);

            for (int y2 = 0; y2 < sof2; ++y2)
            {
                for (int x2 = 0; x2 < sof2; ++x2)
                {
                    V2f posInFace2 (x2, y2);

                    V3f dir2 = CubeMap::direction (face2, dw2, posInFace2);

                    V2f pos2 = CubeMap::pixelPosition (face2, dw2, posInFace2);

                    double weightTotal = 0;
                    double rTotal      = 0;
                    double gTotal      = 0;
                    double bTotal      = 0;
                    double aTotal      = 0;

                    Rgba& pixel2 = pixels2[toInt (pos2.y)][toInt (pos2.x)];

                    for (int f1 = CUBEFACE_POS_X; f1 <= CUBEFACE_NEG_Z; ++f1)
                    {
                        CubeMapFace face1 = CubeMapFace (f1);

                        for (int y1 = 0; y1 < sof1; ++y1)
                        {
                            for (int x1 = 0; x1 < sof1; ++x1)
                            {
                                V2f posInFace1 (x1, y1);

                                V3f dir1 =
                                    CubeMap::direction (face1, dw1, posInFace1);

                                V2f pos1 = CubeMap::pixelPosition (
                                    face1, dw1, posInFace1);

                                double weight = dir1 ^ dir2;

                                if (weight <= 0) continue;

                                Rgba& pixel1 =
                                    pixels1[toInt (pos1.y)][toInt (pos1.x)];

                                weightTotal += weight;
                                rTotal += pixel1.r * weight;
                                gTotal += pixel1.g * weight;
                                bTotal += pixel1.b * weight;
                                aTotal += pixel1.a * weight;
                            }
                        }
                    }

                    pixel2.r = rTotal / weightTotal;
                    pixel2.g = gTotal / weightTotal;
                    pixel2.b = bTotal / weightTotal;
                    pixel2.a = aTotal / weightTotal;
                }
            }
        }

        swap (iptr1, iptr2);
    }

    //
    // Depending on how many times we've re-sampled the image,
    // the result is now either in image1 or in image2.
    // If necessary, copy the result into image1.
    //

    if (iptr1 != &image1)
    {
        if (verbose) cout << "    copying" << endl;

        Box2i dw = iptr1->dataWindow ();
        image1.resize (ENVMAP_CUBE, dw);

        int    w    = dw.max.x - dw.min.x + 1;
        int    h    = dw.max.y - dw.min.y + 1;
        size_t size = w * h * sizeof (Rgba);

        memcpy (&image1.pixels ()[0][0], &iptr1->pixels ()[0][0], size);
    }
}